

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::Pan(BoardView *this,int direction,int amount)

{
  int iVar1;
  ImGuiIO *pIVar2;
  int iVar3;
  
  pIVar2 = ImGui::GetIO();
  iVar1 = (int)((float)amount / this->m_scale);
  if (pIVar2->KeyCtrl == true) {
    iVar1 = iVar1 / this->panModifier;
  }
  switch(direction) {
  case 1:
    iVar1 = -iVar1;
  case 2:
    iVar3 = -iVar1;
    if ((this->m_rotation & 1U) == 0) {
      iVar3 = iVar1;
    }
    if (this->m_current_side == 0) {
      iVar3 = iVar1;
    }
    switch(this->m_rotation) {
    case 0:
switchD_00147b87_caseD_3:
      this->m_dy = (float)iVar3 + this->m_dy;
      break;
    case 1:
switchD_00147b87_caseD_0:
      this->m_dx = this->m_dx - (float)iVar3;
      break;
    case 2:
switchD_00147b87_caseD_1:
      this->m_dy = this->m_dy - (float)iVar3;
      break;
    case 3:
switchD_00147b87_caseD_2:
      this->m_dx = (float)iVar3 + this->m_dx;
    default:
      break;
    }
switchD_00147b1f_default:
    this->m_needsRedraw = true;
    this->m_draggingLastFrame = true;
    return;
  case 3:
    iVar1 = -iVar1;
  case 4:
    iVar3 = -iVar1;
    if ((this->m_rotation & 1U) != 0) {
      iVar3 = iVar1;
    }
    if (this->m_current_side == 0) {
      iVar3 = iVar1;
    }
    switch(this->m_rotation) {
    case 0:
      goto switchD_00147b87_caseD_0;
    case 1:
      goto switchD_00147b87_caseD_1;
    case 2:
      goto switchD_00147b87_caseD_2;
    case 3:
      goto switchD_00147b87_caseD_3;
    default:
      goto switchD_00147b1f_default;
    }
  default:
    goto switchD_00147b1f_default;
  }
}

Assistant:

void BoardView::Pan(int direction, int amount) {
	ImGuiIO &io = ImGui::GetIO();
#define DIR_UP 1
#define DIR_DOWN 2
#define DIR_LEFT 3
#define DIR_RIGHT 4

	amount = amount / m_scale;

	if (io.KeyCtrl) amount /= panModifier;

	switch (direction) {
		case DIR_UP: amount = -amount;
		case DIR_DOWN:
			if ((m_current_side) && (m_rotation % 2)) amount = -amount;
			switch (m_rotation) {
				case 0: m_dy += amount; break;
				case 1: m_dx -= amount; break;
				case 2: m_dy -= amount; break;
				case 3: m_dx += amount; break;
			}
			break;
		case DIR_LEFT: amount = -amount;
		case DIR_RIGHT:
			if ((m_current_side) && ((m_rotation % 2) == 0)) amount = -amount;
			switch (m_rotation) {
				case 0: m_dx -= amount; break;
				case 1: m_dy -= amount; break;
				case 2: m_dx += amount; break;
				case 3: m_dy += amount; break;
			}
			break;
	}

	m_draggingLastFrame = true;
	m_needsRedraw       = true;
}